

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O1

int FFSdecode_in_place(FFSContext iocontext,char *src,void **dest_ptr)

{
  FMFormat_conflict p_Var1;
  int iVar2;
  FFSTypeHandle_conflict ioformat;
  char *dest;
  
  ioformat = FFSTypeHandle_from_encode(iocontext,src);
  if (ioformat == (FFSTypeHandle_conflict)0x0) {
    iVar2 = 0;
  }
  else {
    iVar2 = check_conversion(ioformat);
    if (iVar2 == 0) {
      dest = (char *)0x0;
      iVar2 = 0;
    }
    else {
      p_Var1 = ioformat->body;
      iVar2 = (p_Var1->server_ID).length;
      if (p_Var1->variant != 0) {
        if (p_Var1->IOversion < 4) {
          iVar2 = iVar2 + 4;
        }
        else {
          iVar2 = iVar2 + 8;
        }
      }
      dest = src + (int)((-iVar2 & 7U) + iVar2);
      iVar2 = FFSinternal_decode(ioformat,src,dest,1);
    }
    *dest_ptr = dest;
  }
  return iVar2;
}

Assistant:

extern int
FFSdecode_in_place(FFSContext iocontext, char *src, void **dest_ptr)
{
    FFSTypeHandle ioformat = FFSTypeHandle_from_encode(iocontext, src);
    int header_size;
    int ret;

    if (ioformat == NULL) {
	return 0;
    }
    if (!check_conversion(ioformat)) {
	*dest_ptr = NULL;
	return 0;
    }
    header_size = FFSheader_size(ioformat);
    ret = FFSinternal_decode(ioformat, src, src + header_size, 1);
    *dest_ptr = src + header_size;
    return ret;
}